

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  iVar2 = 0;
  while( true ) {
    if (0x20000 < litLength) {
      __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x125,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
    }
    if (optPtr->priceType == zop_predef) break;
    if (litLength != 0x20000) {
      if (litLength < 0x40) {
        uVar3 = (uint)(byte)(&ZSTD_LLcode_LL_Code)[litLength];
      }
      else {
        uVar3 = 0x1f;
        if (litLength != 0) {
          for (; litLength >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = (uVar3 ^ 0xffffffe0) + 0x33;
      }
      uVar4 = optPtr->litLengthFreq[uVar3] + 1;
      if (optLevel == 0) {
        if (uVar4 == 0) goto LAB_0020a0c3;
        uVar1 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        iVar5 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
      }
      else {
        if (uVar4 == 0) {
LAB_0020a0c3:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                        ,0xab,"unsigned int ZSTD_highbit32(U32)");
        }
        uVar1 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        if (0x16 < uVar1) goto LAB_0020a0e2;
        iVar5 = -((uVar4 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
      }
      iVar5 = (uint)""[uVar3] * 0x100 + optPtr->litLengthSumBasePrice + iVar5;
      goto LAB_0020a097;
    }
    iVar2 = iVar2 + 0x100;
    litLength = 0x1ffff;
  }
  uVar4 = litLength + 1;
  uVar3 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  if (optLevel == 0) {
    iVar5 = uVar3 << 8;
  }
  else {
    if (0x16 < uVar3) {
LAB_0020a0e2:
      __assert_fail("hb + BITCOST_ACCURACY < 31",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x3c,"U32 ZSTD_fracWeight(U32)");
    }
    iVar5 = (uVar4 * 0x100 >> ((byte)uVar3 & 0x1f)) + uVar3 * 0x100;
  }
LAB_0020a097:
  return iVar5 + iVar2;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}